

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall tonk::SessionOutgoing::Flush(SessionOutgoing *this)

{
  OutgoingQueueCommon *__mutex;
  Allocator *this_00;
  uint *puVar1;
  int iVar2;
  OutgoingQueuedDatagram *pOVar3;
  undefined4 uVar4;
  undefined8 ptr;
  WindowHeader *pWVar5;
  int __e;
  int iVar6;
  SiameseResult SVar7;
  OutgoingQueuedDatagram *pOVar8;
  uint8_t *ptr_00;
  uint8_t *puVar9;
  _func_int **pp_Var10;
  uint uVar11;
  __pthread_internal_list *destBuffer;
  SessionOutgoing *in_RSI;
  Locker locker;
  OutgoingQueuedDatagram *pOVar12;
  int iVar13;
  __pthread_internal_list *p_Var14;
  bool bVar15;
  Result compressResult;
  uint writtenBytes;
  int local_cc;
  undefined1 local_a8 [88];
  undefined1 local_50 [24];
  WindowHeader *local_38;
  
  if (((in_RSI->HasPeerAddress)._M_base._M_i & 1U) == 0) {
LAB_0014c2cf:
    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
    return (Result)(ErrorResult *)this;
  }
  local_a8._64_8_ = in_RSI->Queues;
  if (in_RSI->Queues[0].QueuedBytes == 0) {
    pOVar12 = (OutgoingQueuedDatagram *)0x0;
LAB_0014bb0a:
    local_a8._56_8_ = &in_RSI->OutgoingQueueLock;
    __mutex = &in_RSI->super_OutgoingQueueCommon;
    this_00 = &(in_RSI->super_OutgoingQueueCommon).WriteAllocator.Allocator;
    local_50._16_8_ = &in_RSI->Compressor;
    p_Var14 = (__pthread_internal_list *)0x1;
    ptr_00 = (uint8_t *)0x0;
    local_cc = 0;
    local_a8._16_8_ = 0;
    local_a8._24_8_ = pOVar12;
    do {
      if (((uint *)(local_a8._64_8_ + 0x20))[(long)p_Var14 * 10] == 0) {
        iVar6 = 6;
      }
      else {
        local_38 = (WindowHeader *)((UsedMaskT *)local_a8._64_8_ + (long)p_Var14 * 0x28);
        local_a8._32_8_ = p_Var14;
        do {
          if (((__pthread_internal_list *)0x1 < p_Var14) &&
             ((((in_RSI->Deps).SenderControl)->AvailableTokens).super___atomic_base<int>._M_i < 1))
          {
            iVar6 = 9;
            goto LAB_0014c222;
          }
          SVar7 = siamese_encoder_is_ready(in_RSI->FECEncoder);
          iVar6 = 9;
          if (SVar7 == Siamese_Success) {
            iVar6 = pthread_mutex_lock((pthread_mutex_t *)local_a8._56_8_);
            pWVar5 = local_38;
            if (iVar6 != 0) goto LAB_0014c2eb;
            pOVar8 = OutgoingQueue::FlushPeek((OutgoingQueue *)local_38);
            if (pOVar8 == (OutgoingQueuedDatagram *)0x0) {
              iVar6 = 7;
            }
            else {
              pOVar12 = *(OutgoingQueuedDatagram **)&pWVar5->field_0x10;
              pOVar3 = pOVar12->Next;
              *(OutgoingQueuedDatagram **)&pWVar5->field_0x10 = pOVar3;
              *(uint *)&pWVar5->field_0x20 = *(uint *)&pWVar5->field_0x20 - pOVar12->NextWriteOffset
              ;
              iVar6 = 0;
              if (pOVar3 == (OutgoingQueuedDatagram *)0x0) {
                *(OutgoingQueuedDatagram **)&pWVar5->field_0x18 = (OutgoingQueuedDatagram *)0x0;
              }
            }
            pthread_mutex_unlock((pthread_mutex_t *)local_a8._56_8_);
            if (pOVar8 != (OutgoingQueuedDatagram *)0x0) {
              destBuffer = (__pthread_internal_list *)(ulong)pOVar8->NextWriteOffset;
              local_a8._48_8_ = pOVar8;
              if (ptr_00 == (uint8_t *)0x0) {
                iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                if (iVar6 != 0) goto LAB_0014c2eb;
                ptr_00 = pktalloc::Allocator::Allocate(this_00,0xa8c);
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                ptr = local_a8._24_8_;
                if (ptr_00 == (uint8_t *)0x0) {
                  local_a8._72_8_ = local_50;
                  local_a8._80_8_ = (WindowHeader *)0x0;
                  local_50[0] = (UsedMaskT)0x0;
                  pp_Var10 = (_func_int **)operator_new(0x38);
                  *pp_Var10 = (_func_int *)"Out of memory";
                  pp_Var10[1] = (_func_int *)(pp_Var10 + 3);
                  pp_Var10[2] = (_func_int *)0x0;
                  *(undefined1 *)(pp_Var10 + 3) = 0;
                  *(undefined4 *)(pp_Var10 + 5) = 0;
                  pp_Var10[6] = (_func_int *)0x10;
                  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var10;
                  iVar6 = 1;
                  ptr_00 = (uint8_t *)0x0;
                  goto LAB_0014bba9;
                }
                ptr_00[0] = '\0';
                ptr_00[1] = '\0';
                ptr_00[2] = '\0';
                ptr_00[3] = '\0';
                ptr_00[4] = '\0';
                ptr_00[5] = '\0';
                ptr_00[6] = '\0';
                ptr_00[7] = '\0';
                ptr_00[8] = '\0';
                ptr_00[9] = '\0';
                ptr_00[10] = '\0';
                ptr_00[0xb] = '\0';
                ptr_00[0xc] = '\0';
                ptr_00[0xd] = '\0';
                ptr_00[0xe] = '\0';
                ptr_00[0xf] = '\0';
                if ((OutgoingQueuedDatagram *)local_a8._24_8_ != (OutgoingQueuedDatagram *)0x0) {
                  uVar11 = *(uint *)(local_a8._24_8_ + 8);
                  memcpy(ptr_00 + 0x10,(uint8_t *)(local_a8._24_8_ + 0x10),(ulong)uVar11);
                  *(uint *)(ptr_00 + 8) = uVar11;
                  local_a8._16_8_ = (ulong)uVar11;
                  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                  if (iVar6 != 0) goto LAB_0014c2eb;
                  pktalloc::Allocator::Free(this_00,(uint8_t *)ptr);
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                }
                local_a8._24_8_ = (OutgoingQueuedDatagram *)0x0;
              }
              iVar13 = 0;
              if (((__pthread_internal_list *)0x1 < (ulong)local_a8._32_8_) &&
                 (iVar13 = 0, (in_RSI->Deps).EnableCompression == true)) {
                local_a8._12_4_ = 0;
                local_a8._40_8_ = destBuffer;
                MessageCompressor::Compress
                          ((MessageCompressor *)local_a8,(uint8_t *)local_50._16_8_,
                           (uint)pOVar8->Data,(uint8_t *)destBuffer,
                           (uint *)(ptr_00 + (ulong)*(uint *)(ptr_00 + 8) + 0x12));
                if ((ErrorResult *)local_a8._0_8_ == (ErrorResult *)0x0) {
                  if (local_a8._12_4_ == 0) {
                    iVar13 = local_cc * 2;
                    iVar6 = 0;
                    local_cc = 1;
                  }
                  else {
                    uVar11 = *(uint *)(ptr_00 + 8);
                    *(ushort *)(ptr_00 + (ulong)uVar11 + 0x10) = (ushort)local_a8._12_4_ | 0x2800;
                    uVar11 = uVar11 + 2 + local_a8._12_4_;
                    if ((in_RSI->super_OutgoingQueueCommon).MaxMessageSectionBytes < uVar11) {
                      local_a8._12_4_ = local_a8._12_4_ + 2;
                      iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                      if (iVar6 != 0) {
LAB_0014c2f9:
                        std::__throw_system_error(iVar6);
                      }
                      puVar9 = pktalloc::Allocator::Allocate(this_00,0xa8c);
                      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                      uVar4 = local_a8._12_4_;
                      if (puVar9 == (uint8_t *)0x0) {
                        local_a8._72_8_ = local_50;
                        local_a8._80_8_ = (WindowHeader *)0x0;
                        local_50[0] = (UsedMaskT)0x0;
                        pp_Var10 = (_func_int **)operator_new(0x38);
                        *pp_Var10 = (_func_int *)"Out of memory";
                        pp_Var10[1] = (_func_int *)(pp_Var10 + 3);
                        pp_Var10[2] = (_func_int *)0x0;
                        *(undefined1 *)(pp_Var10 + 3) = 0;
                        *(undefined4 *)(pp_Var10 + 5) = 0;
                        pp_Var10[6] = (_func_int *)0x10;
                        (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var10;
                        iVar6 = 1;
                      }
                      else {
                        puVar9[0] = '\0';
                        puVar9[1] = '\0';
                        puVar9[2] = '\0';
                        puVar9[3] = '\0';
                        puVar9[4] = '\0';
                        puVar9[5] = '\0';
                        puVar9[6] = '\0';
                        puVar9[7] = '\0';
                        puVar9[8] = '\0';
                        puVar9[9] = '\0';
                        puVar9[10] = '\0';
                        puVar9[0xb] = '\0';
                        puVar9[0xc] = '\0';
                        puVar9[0xd] = '\0';
                        puVar9[0xe] = '\0';
                        puVar9[0xf] = '\0';
                        memcpy(puVar9 + 0x10,ptr_00 + (ulong)*(uint *)(ptr_00 + 8) + 0x10,
                               (ulong)(uint)local_a8._12_4_);
                        *(undefined4 *)(puVar9 + 8) = uVar4;
                        *(int *)(puVar9 + 0xc) = ((int)local_a8._40_8_ - uVar4) + 2;
                        iVar13 = *(int *)(ptr_00 + 8);
                        iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                        if (iVar6 != 0) goto LAB_0014c2f9;
                        pktalloc::Allocator::Shrink(this_00,ptr_00,iVar13 + 0x3f);
                        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                        sendQueuedReliable(this,(OutgoingQueuedDatagram *)in_RSI,(uint)ptr_00);
                        pp_Var10 = (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing;
                        iVar6 = 1;
                        if (pp_Var10 == (_func_int **)0x0) {
                          iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                          if (iVar6 != 0) {
                            std::__throw_system_error(iVar6);
                          }
                          pktalloc::Allocator::Free(this_00,(uint8_t *)local_a8._48_8_);
                          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                          iVar6 = 8;
                          local_a8._16_8_ = 0;
                          ptr_00 = puVar9;
                        }
                        if (pp_Var10 == (_func_int **)0x0) {
                          Result::~Result((Result *)this);
                        }
                      }
                    }
                    else {
                      *(uint *)(ptr_00 + 8) = uVar11;
                      *(int *)(ptr_00 + 0xc) =
                           *(int *)(ptr_00 + 0xc) + ((int)local_a8._40_8_ - local_a8._12_4_);
                      local_a8._12_4_ = local_a8._12_4_ + 2;
                      iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                      if (iVar6 != 0) {
                        std::__throw_system_error(iVar6);
                      }
                      pktalloc::Allocator::Free(this_00,(uint8_t *)local_a8._48_8_);
                      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                      iVar6 = 8;
                    }
                    local_cc = 0;
                    iVar13 = 0;
                  }
                }
                else {
                  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing =
                       (_func_int **)local_a8._0_8_;
                  local_a8._0_8_ = (ErrorResult *)0x0;
                  iVar13 = 0;
                  iVar6 = 1;
                }
                Result::~Result((Result *)local_a8);
                destBuffer = (__pthread_internal_list *)local_a8._40_8_;
                p_Var14 = (__pthread_internal_list *)local_a8._32_8_;
                if (iVar6 != 0) goto LAB_0014bba9;
              }
              iVar2 = *(int *)(ptr_00 + 8);
              if ((in_RSI->super_OutgoingQueueCommon).MaxMessageSectionBytes <
                  (uint)(iVar13 + iVar2 + (int)destBuffer)) {
                iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                if (iVar6 != 0) goto LAB_0014c2eb;
                pktalloc::Allocator::Shrink(this_00,ptr_00,iVar2 + 0x3f);
                pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                sendQueuedReliable((SessionOutgoing *)local_a8,(OutgoingQueuedDatagram *)in_RSI,
                                   (uint)ptr_00);
                if ((ErrorResult *)local_a8._0_8_ == (ErrorResult *)0x0) {
                  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
                  if (iVar6 != 0) {
                    std::__throw_system_error(iVar6);
                  }
                  ptr_00 = pktalloc::Allocator::Allocate(this_00,0xa8c);
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                  if (ptr_00 == (uint8_t *)0x0) {
                    local_a8._72_8_ = local_50;
                    local_a8._80_8_ = (WindowHeader *)0x0;
                    local_50[0] = (UsedMaskT)0x0;
                    pp_Var10 = (_func_int **)operator_new(0x38);
                    *pp_Var10 = (_func_int *)"Out of memory";
                    pp_Var10[1] = (_func_int *)(pp_Var10 + 3);
                    pp_Var10[2] = (_func_int *)0x0;
                    *(undefined1 *)(pp_Var10 + 3) = 0;
                    *(undefined4 *)(pp_Var10 + 5) = 0;
                    pp_Var10[6] = (_func_int *)0x10;
                    (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var10;
                    ptr_00 = (uint8_t *)0x0;
                    goto LAB_0014c0a3;
                  }
                  ptr_00[0] = '\0';
                  ptr_00[1] = '\0';
                  ptr_00[2] = '\0';
                  ptr_00[3] = '\0';
                  ptr_00[4] = '\0';
                  ptr_00[5] = '\0';
                  ptr_00[6] = '\0';
                  ptr_00[7] = '\0';
                  ptr_00[8] = '\0';
                  ptr_00[9] = '\0';
                  ptr_00[10] = '\0';
                  ptr_00[0xb] = '\0';
                  ptr_00[0xc] = '\0';
                  ptr_00[0xd] = '\0';
                  ptr_00[0xe] = '\0';
                  ptr_00[0xf] = '\0';
                  bVar15 = true;
                  local_a8._16_8_ = 0;
                  local_cc = 0;
                  iVar13 = 0;
                }
                else {
                  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing =
                       (_func_int **)local_a8._0_8_;
                  local_a8._0_8_ = (ErrorResult *)0x0;
LAB_0014c0a3:
                  bVar15 = false;
                }
                Result::~Result((Result *)local_a8);
                iVar6 = 1;
                p_Var14 = (__pthread_internal_list *)local_a8._32_8_;
                if (!bVar15) goto LAB_0014bba9;
              }
              if (iVar13 != 0) {
                uVar11 = *(uint *)(ptr_00 + 8);
                (ptr_00 + (ulong)uVar11 + 0x10)[0] = '\0';
                (ptr_00 + (ulong)uVar11 + 0x10)[1] = '(';
                *(uint *)(ptr_00 + 8) = uVar11 + 2;
              }
              memcpy(ptr_00 + (ulong)*(uint *)(ptr_00 + 8) + 0x10,pOVar8->Data,(size_t)destBuffer);
              *(int *)(ptr_00 + 8) = *(int *)(ptr_00 + 8) + (int)destBuffer;
              iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
              if (iVar6 != 0) goto LAB_0014c2eb;
              pktalloc::Allocator::Free(this_00,(uint8_t *)local_a8._48_8_);
              p_Var14 = (__pthread_internal_list *)local_a8._32_8_;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              iVar6 = 0;
            }
          }
LAB_0014bba9:
        } while ((iVar6 == 0) || (iVar6 == 8));
        if (iVar6 == 7) {
          iVar6 = 0;
        }
      }
LAB_0014c222:
      if ((iVar6 != 6) && (iVar6 != 0)) goto LAB_0014c240;
      p_Var14 = (__pthread_internal_list *)((long)&p_Var14->__prev + 1);
    } while (p_Var14 != (__pthread_internal_list *)0x4);
    iVar6 = 4;
LAB_0014c240:
    if ((iVar6 != 9) && (iVar6 != 4)) {
      return (Result)(ErrorResult *)this;
    }
    if ((OutgoingQueuedDatagram *)local_a8._24_8_ != (OutgoingQueuedDatagram *)0x0) {
      sendQueuedDatagram(in_RSI,(OutgoingQueuedDatagram *)local_a8._24_8_,0,0);
    }
    if (ptr_00 == (uint8_t *)0x0) goto LAB_0014c2cf;
    iVar13 = *(int *)(ptr_00 + 8);
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar13 == 0) {
      if (iVar6 == 0) {
        pktalloc::Allocator::Free(this_00,ptr_00);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        goto LAB_0014c2cf;
      }
    }
    else if (iVar6 == 0) {
      pktalloc::Allocator::Shrink(this_00,ptr_00,iVar13 + 0x3f);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      sendQueuedReliable(this,(OutgoingQueuedDatagram *)in_RSI,(uint)ptr_00);
      return (Result)(ErrorResult *)this;
    }
  }
  else {
    while (iVar6 = pthread_mutex_lock((pthread_mutex_t *)&in_RSI->OutgoingQueueLock), iVar6 == 0) {
      pOVar8 = OutgoingQueue::FlushPeek((OutgoingQueue *)local_a8._64_8_);
      if (pOVar8 == (OutgoingQueuedDatagram *)0x0) {
        bVar15 = true;
        pOVar12 = (OutgoingQueuedDatagram *)0x0;
      }
      else {
        pOVar12 = in_RSI->Queues[0].OldestQueued;
        pOVar3 = pOVar12->Next;
        in_RSI->Queues[0].OldestQueued = pOVar3;
        puVar1 = &in_RSI->Queues[0].QueuedBytes;
        *puVar1 = *puVar1 - pOVar12->NextWriteOffset;
        bVar15 = pOVar3 == (OutgoingQueuedDatagram *)0x0;
        pOVar12 = pOVar8;
        if (bVar15) {
          in_RSI->Queues[0].NewestQueued = (OutgoingQueuedDatagram *)0x0;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->OutgoingQueueLock);
      if ((bool)(pOVar8 == (OutgoingQueuedDatagram *)0x0 | bVar15)) goto LAB_0014bb0a;
      sendQueuedDatagram(in_RSI,pOVar8,0,0);
    }
  }
LAB_0014c2eb:
  std::__throw_system_error(iVar6);
}

Assistant:

Result SessionOutgoing::Flush()
{
    // Note: There are a number of failure paths that leak objects.
    // This seems okay since in response to the error we disconnect,
    // and all of these allocations get automatically freed afterwards

    // If peer address is not known yet:
    if (!HasPeerAddress) {
        return Result::Success();
    }

    // Try to combine the last unreliable frames with the first reliable frames
    OutgoingQueuedDatagram* finalUnreliable = nullptr;

    // For the unreliable queue:

    OutgoingQueue* unreliableQueue = &Queues[Queue_Unreliable];

    // Quick skip for common case with no data waiting:
    if (unreliableQueue->GetQueuedBytes() > 0)
    // For all datagrams for this queue:
    for (;;)
    {
        // Grab next datagram from queue (if any)
        OutgoingQueuedDatagram* datagram;
        bool isEmpty = true;
        {
            Locker locker(OutgoingQueueLock);

            // Look at the next datagram
            datagram = unreliableQueue->FlushPeek();

            if (datagram) {
                // Pop it off the front
                isEmpty = unreliableQueue->PopIsEmpty();
            }
        }

        if (!datagram) {
            // Continue on to reliable queued data
            break;
        }

        TONK_DEBUG_ASSERT(datagram->NextWriteOffset > 0);

        if (isEmpty) {
            finalUnreliable = datagram;
            break;
        }

        // There are more to send- send this one now
        sendQueuedUnreliable(datagram);
    } // Next datagram in queue

    // Combine datagrams together if compression works well enough
    OutgoingQueuedDatagram* combined = nullptr;

    // Separate failed compression buffers with an empty compression frame
    bool prevCompressFailed = false;

    // Offset to reliable data
    unsigned reliableOffset = 0;

    // Send Reliable queue first and then LowPri queue datagrams
    for (unsigned queueIndex = Queue_Unmetered; queueIndex < Queue_Count; ++queueIndex)
    {
        OutgoingQueue* queue = &Queues[queueIndex];

        // Quick skip for common case with no data waiting:
        if (queue->GetQueuedBytes() <= 0) {
            continue;
        }

        // For all datagrams for this queue:
        for (;;)
        {
            // If this is a Reliable or LowPri message:
            if (queueIndex >= Queue_Reliable) {
                // If there is no space left:
                if (Deps.SenderControl->GetAvailableBytes() <= 0) {
                    goto DoneSending;
                }
            }

            const SiameseResult isReady = siamese_encoder_is_ready(FECEncoder);
            if (isReady != Siamese_Success) {
                //Deps.Logger->Warning("SiameseFEC not ready for more data. Delaying sending more until some data is acknowledged");
                goto DoneSending;
            }

            // Grab next datagram from queue (if any)
            // TBD: This lock is a little heavy - Sometimes it waits for
            // a queue insertion to finish.  It would be nicer if we flushed
            // just once at the top of the Flush() and then pulled results
            // off the protected queue a bit faster.
            OutgoingQueuedDatagram* datagram;
            {
                Locker locker(OutgoingQueueLock);
                datagram = queue->FlushPeek();
                if (!datagram) {
                    // Done with this queue
                    break;
                }
                queue->PopIsEmpty();
            }

            const unsigned datagramBytes = datagram->NextWriteOffset;
            const uint8_t* datagramData = datagram->Data;

            // TBD: Always allocate the combining buffer even if it is just one unordered message
            // TBD: We could be compressing directly into this buffer in some cases
            if (!combined)
            {
                combined = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
                    protocol::kMaxPossibleDatagramByteLimit * 2);
                if (!combined) {
                    return Result::OutOfMemory();
                }
                combined->Initialize();

                // If there was some unreliable message data to combine:
                if (finalUnreliable)
                {
                    // Indicate that the reliable data starts at an offset
                    const unsigned unreliableBytes = finalUnreliable->NextWriteOffset;
                    reliableOffset = unreliableBytes;

                    // Combine final unreliable messages with first reliable messages
                    memcpy(combined->Data, finalUnreliable->Data, unreliableBytes);
                    combined->NextWriteOffset = unreliableBytes;

#ifdef TONK_DETAILED_STATS
                    combined->AccumulateStats(finalUnreliable);
#endif // TONK_DETAILED_STATS

                    // Prevent this from running again
                    WriteAllocator.Free(finalUnreliable);
                    finalUnreliable = nullptr;
                } // End if there was a final unreliable message to combine
            } // End if no 'combined' buffer allocated yet

            unsigned syncOverhead = 0;

            // If the data is in a reliable-in-order queue and compression is enabled:
            if (queueIndex > Queue_Unmetered && Deps.EnableCompression)
            {
                unsigned writtenBytes = 0;

                // Compress datagram to scratch space
                const Result compressResult = Compressor.Compress(
                    datagramData,
                    datagramBytes,
                    combined->Data + combined->NextWriteOffset + protocol::kMessageFrameBytes,
                    writtenBytes);
                if (compressResult.IsFail()) {
                    return compressResult;
                }

                // If compression succeeded:
                if (writtenBytes > 0)
                {
                    TONK_DEBUG_ASSERT(writtenBytes < datagramBytes);

                    // Write Compressed frame header
                    protocol::WriteMessageFrameHeader(
                        combined->Data + combined->NextWriteOffset,
                        protocol::MessageType_Compressed,
                        writtenBytes);
                    writtenBytes += protocol::kMessageFrameBytes;

                    // Clear previous compression failure
                    prevCompressFailed = false;

                    // If there is enough space to keep it in the combined datagram:
                    if (combined->NextWriteOffset + writtenBytes <= MaxMessageSectionBytes)
                    {
                        // Data is already in-place
                        combined->NextWriteOffset += writtenBytes;

                        // Keep track of compression savings
                        combined->CompressionSavings += datagramBytes + protocol::kMessageFrameBytes - writtenBytes;

#ifdef TONK_DETAILED_STATS
                        // TBD: Do not keep the original reliable message breakdown.
                        // Replace those counters with the smaller compressed sent byte count
                        combined->Stats[Stats_CompressedBytesSent] += writtenBytes - protocol::kMessageFrameBytes;
                        combined->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
                        combined->Stats[Stats_CompressionSavedBytes] += datagramBytes;
#endif // TONK_DETAILED_STATS

                        WriteAllocator.Free(datagram);
                        continue;
                    }

                    // Move the compressed data to a new combined datagram:

                    OutgoingQueuedDatagram* newCombined = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
                        protocol::kMaxPossibleDatagramByteLimit * 2);
                    if (!newCombined) {
                        return Result::OutOfMemory();
                    }
                    newCombined->Initialize();

                    memcpy(newCombined->Data, combined->Data + combined->NextWriteOffset, writtenBytes);
                    newCombined->NextWriteOffset = writtenBytes;

                    // Keep track of compression savings
                    newCombined->CompressionSavings = datagramBytes + protocol::kMessageFrameBytes - writtenBytes;

                    const Result result = shrinkWrapAndSendReliable(combined, reliableOffset);
                    if (result.IsFail()) {
                        return result;
                    }

                    combined = newCombined;
                    reliableOffset = 0;

#ifdef TONK_DETAILED_STATS
                    // TBD: Do not keep the original reliable message breakdown.
                    // Replace those counters with the smaller compressed sent byte count
                    combined->Stats[Stats_CompressedBytesSent] += writtenBytes - protocol::kMessageFrameBytes;
                    combined->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
#endif // TONK_DETAILED_STATS

                    WriteAllocator.Free(datagram);
                    continue;
                } // End if compression succeeded

                // If previous compression failed too:
                if (prevCompressFailed) {
                    // Receiver will need a frame injected to know where the
                    // buffer split is at.
                    syncOverhead = protocol::kMessageFrameBytes;
                }

                prevCompressFailed = true;
            } // End if compression should be attempted
            else {
                TONK_DEBUG_ASSERT(!prevCompressFailed); // Should not have compressed anything yet
            }

            // If there is not enough space:
            if (combined->NextWriteOffset + datagramBytes + syncOverhead > MaxMessageSectionBytes)
            {
                const Result result = shrinkWrapAndSendReliable(combined, reliableOffset);
                if (result.IsFail()) {
                    return result;
                }

                combined = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
                    protocol::kMaxPossibleDatagramByteLimit * 2);
                if (!combined) {
                    return Result::OutOfMemory();
                }
                combined->Initialize();

                // All data is reliable after the first reliable datagram
                reliableOffset = 0;

                // Reset the compression failed flag
                prevCompressFailed = false;
                syncOverhead = 0;
            }

            // If we need to write a frame to synchronize compression history:
            if (syncOverhead != 0)
            {
                // See the "Why a Sync Frame is Needed" note in the
                // PacketCompression.h header for why this is needed.
                protocol::WriteMessageFrameHeader(
                    combined->Data + combined->NextWriteOffset,
                    protocol::MessageType_Compressed,
                    0);

#ifdef TONK_DETAILED_STATS
                combined->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
#endif // TONK_DETAILED_STATS

                combined->NextWriteOffset += protocol::kMessageFrameBytes;
            } // End if adding sync frame

            // Copy the datagram or compressed data to the end of the combined buffer
            memcpy(
                combined->Data + combined->NextWriteOffset,
                datagramData,
                datagramBytes);

            combined->NextWriteOffset += datagramBytes;

#ifdef TONK_DETAILED_STATS
            combined->AccumulateStats(datagram);
#endif // TONK_DETAILED_STATS

            WriteAllocator.Free(datagram);
        } // Next datagram in queue
    } // Next priority queue

DoneSending:

    // If we have still not sent the final unreliable datagram:
    if (finalUnreliable) {
        sendQueuedUnreliable(finalUnreliable);
    }

    if (!combined) {
        return Result::Success();
    }

    // If we allocated a buffer we didn't end up needing:
    if (combined->NextWriteOffset <= 0)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        WriteAllocator.Free(combined);
        return Result::Success();
    }
    // Otherwise this will send at least one empty datagram during handshaking

    return shrinkWrapAndSendReliable(combined, reliableOffset);
}